

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O1

Url * __thiscall
Vault::KeyValue::getMetadataUrl(Url *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *pCVar1;
  long *plVar2;
  long *plVar3;
  long *local_60;
  long local_58;
  long local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string local_40;
  
  pCVar1 = this->client_;
  Vault::operator+(&local_40,"/v1/",&this->mount_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    uStack_48 = (undefined4)plVar2[3];
    uStack_44 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar2;
  }
  local_58 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,&local_60,path);
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::KeyValue::getMetadataUrl(const Vault::Path &path) {
  return Vault::Url{client_.getUrl("/v1/" + mount_ + "/metadata/", path)};
}